

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

int __thiscall
gmlc::utilities::stringOps::trailingStringInt
          (stringOps *this,string_view input,string *output,int defNum)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  stringOps *psVar4;
  char *__s;
  stringOps *psVar5;
  int num;
  int local_44;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input._M_str;
  __s = (char *)input._M_len;
  local_44 = (int)output;
  if ((this == (stringOps *)0x0) ||
     (cVar1 = (__s + -1)[(long)this], (int)cVar1 - 0x3aU < 0xfffffff6)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (local_38,0,local_38->_M_string_length,__s,(size_type)this);
  }
  else {
    local_40 = __s + (long)this;
    psVar4 = (stringOps *)0x0;
    pcVar3 = __s;
    do {
      pvVar2 = memchr("0123456789",(int)(pcVar3 + -1)[(long)this],10);
      if (pvVar2 == (void *)0x0) {
        psVar5 = this + ~(ulong)psVar4;
        if (psVar4 == (stringOps *)0x1) {
          local_44 = cVar1 + -0x30;
          psVar4 = psVar5;
        }
        else {
          if ((this < (stringOps *)0xb) || (psVar4 = this + -10, psVar4 <= psVar5))
          goto LAB_003a1f41;
          std::from_chars<int>(__s + (long)this + -9,local_40,&local_44,10);
        }
        goto LAB_003a1f64;
      }
      psVar4 = psVar4 + 1;
      pcVar3 = pcVar3 + -1;
    } while (this != psVar4);
    if (this < (stringOps *)0xb) {
      local_38->_M_string_length = 0;
      *(local_38->_M_dataplus)._M_p = '\0';
      std::from_chars<int>(__s,local_40,&local_44,10);
    }
    else {
      psVar5 = this + -10;
LAB_003a1f41:
      if (this <= psVar5) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   psVar5 + 1,this);
      }
      std::from_chars<int>((char *)(psVar5 + 1 + (long)__s),local_40,&local_44,10);
      psVar4 = psVar5;
LAB_003a1f64:
      if ((__s[(long)psVar4] != '#') && (__s[(long)psVar4] != '_')) {
        psVar4 = psVar4 + 1;
      }
      if (this < psVar4) {
        psVar4 = this;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(local_38,0,local_38->_M_string_length,__s,(size_type)psVar4);
    }
  }
  return local_44;
}

Assistant:

int trailingStringInt(
        std::string_view input,
        std::string& output,
        int defNum) noexcept
    {
        if ((input.empty()) || (isdigit(input.back()) == 0)) {
            output = input;
            return defNum;
        }
        int num = defNum;
        auto pos1 = input.find_last_not_of(digits);
        if (pos1 == std::string::npos)  // in case the whole thing is a number
        {
            if (input.length() <= 10) {
                output.clear();
                std::from_chars(input.data(), input.data() + input.size(), num);
                return num;
            }
            pos1 = input.length() - 10;
        }

        size_t length = input.length();
        if (pos1 == length - 2) {
            num = input.back() - '0';
        } else if (length <= 10 || pos1 >= length - 10) {
            auto sub = input.substr(pos1 + 1);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
        } else {
            auto sub = input.substr(length - 9);
            std::from_chars(sub.data(), sub.data() + sub.size(), num);
            pos1 = length - 10;
        }

        if (input[pos1] == '_' || input[pos1] == '#') {
            output = input.substr(0, pos1);
        } else {
            output = input.substr(0, pos1 + 1);
        }

        return num;
    }